

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O3

void cf_chacha20_core(uint8_t *key0,uint8_t *key1,uint8_t *nonce,uint8_t *constant,uint8_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  
  uVar1 = *(uint *)(constant + 4);
  uVar2 = *(uint *)(constant + 8);
  uVar3 = *(uint *)(constant + 0xc);
  uVar4 = *(uint *)key0;
  uVar5 = *(uint *)(key0 + 4);
  uVar6 = *(uint *)(key0 + 8);
  uVar7 = *(uint *)(key0 + 0xc);
  uVar8 = *(uint *)key1;
  uVar9 = *(uint *)(key1 + 4);
  uVar10 = *(uint *)(key1 + 8);
  uVar11 = *(uint *)(key1 + 0xc);
  uVar12 = *(uint *)nonce;
  uVar13 = *(uint *)(nonce + 4);
  uVar14 = *(uint *)(nonce + 8);
  uVar15 = *(uint *)(nonce + 0xc);
  iVar21 = 10;
  uVar18 = uVar6;
  uVar25 = uVar8;
  uVar23 = uVar13;
  uVar27 = uVar14;
  uVar26 = uVar9;
  uVar22 = uVar7;
  uVar19 = uVar5;
  uVar17 = uVar4;
  uVar29 = uVar3;
  uVar30 = uVar2;
  uVar20 = uVar1;
  local_94 = *(uint *)constant;
  local_90 = uVar12;
  local_8c = uVar10;
  local_88 = uVar11;
  local_84 = uVar15;
  do {
    local_90 = local_90 ^ local_94 + uVar17;
    uVar24 = local_90 << 0x10 | local_90 >> 0x10;
    uVar25 = uVar25 + uVar24;
    uVar16 = uVar17 ^ uVar25;
    uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
    local_94 = local_94 + uVar17 + uVar16;
    uVar24 = uVar24 ^ local_94;
    uVar24 = uVar24 << 8 | uVar24 >> 0x18;
    uVar25 = uVar25 + uVar24;
    uVar16 = uVar16 ^ uVar25;
    uVar17 = uVar16 << 7 | uVar16 >> 0x19;
    uVar23 = uVar23 ^ uVar20 + uVar19;
    uVar16 = uVar23 << 0x10 | uVar23 >> 0x10;
    uVar26 = uVar26 + uVar16;
    uVar23 = uVar19 ^ uVar26;
    uVar23 = uVar23 << 0xc | uVar23 >> 0x14;
    uVar20 = uVar20 + uVar19 + uVar23;
    uVar16 = uVar16 ^ uVar20;
    uVar16 = uVar16 << 8 | uVar16 >> 0x18;
    uVar26 = uVar26 + uVar16;
    uVar23 = uVar23 ^ uVar26;
    uVar19 = uVar23 << 7 | uVar23 >> 0x19;
    uVar27 = uVar27 ^ uVar30 + uVar18;
    uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
    local_8c = local_8c + uVar27;
    uVar23 = uVar18 ^ local_8c;
    uVar23 = uVar23 << 0xc | uVar23 >> 0x14;
    uVar30 = uVar30 + uVar18 + uVar23;
    uVar27 = uVar27 ^ uVar30;
    uVar28 = uVar27 << 8 | uVar27 >> 0x18;
    local_8c = local_8c + uVar28;
    uVar23 = uVar23 ^ local_8c;
    uVar27 = uVar23 << 7 | uVar23 >> 0x19;
    local_84 = local_84 ^ uVar29 + uVar22;
    uVar23 = local_84 << 0x10 | local_84 >> 0x10;
    local_88 = local_88 + uVar23;
    uVar18 = uVar22 ^ local_88;
    uVar18 = uVar18 << 0xc | uVar18 >> 0x14;
    uVar29 = uVar29 + uVar22 + uVar18;
    uVar23 = uVar23 ^ uVar29;
    uVar22 = uVar23 << 8 | uVar23 >> 0x18;
    local_88 = local_88 + uVar22;
    uVar18 = uVar18 ^ local_88;
    uVar23 = uVar18 << 7 | uVar18 >> 0x19;
    local_94 = local_94 + uVar19;
    uVar22 = uVar22 ^ local_94;
    uVar22 = uVar22 << 0x10 | uVar22 >> 0x10;
    local_8c = local_8c + uVar22;
    uVar19 = uVar19 ^ local_8c;
    uVar18 = uVar19 << 0xc | uVar19 >> 0x14;
    local_94 = local_94 + uVar18;
    uVar22 = uVar22 ^ local_94;
    local_84 = uVar22 << 8 | uVar22 >> 0x18;
    local_8c = local_8c + local_84;
    uVar18 = uVar18 ^ local_8c;
    uVar19 = uVar18 << 7 | uVar18 >> 0x19;
    uVar20 = uVar20 + uVar27;
    uVar24 = uVar24 ^ uVar20;
    uVar22 = uVar24 << 0x10 | uVar24 >> 0x10;
    local_88 = local_88 + uVar22;
    uVar27 = uVar27 ^ local_88;
    uVar18 = uVar27 << 0xc | uVar27 >> 0x14;
    uVar20 = uVar20 + uVar18;
    uVar22 = uVar22 ^ uVar20;
    local_90 = uVar22 << 8 | uVar22 >> 0x18;
    local_88 = local_88 + local_90;
    uVar18 = uVar18 ^ local_88;
    uVar18 = uVar18 << 7 | uVar18 >> 0x19;
    uVar30 = uVar30 + uVar23;
    uVar16 = uVar16 ^ uVar30;
    uVar22 = uVar16 << 0x10 | uVar16 >> 0x10;
    uVar25 = uVar25 + uVar22;
    uVar23 = uVar23 ^ uVar25;
    uVar27 = uVar23 << 0xc | uVar23 >> 0x14;
    uVar30 = uVar30 + uVar27;
    uVar22 = uVar22 ^ uVar30;
    uVar23 = uVar22 << 8 | uVar22 >> 0x18;
    uVar25 = uVar25 + uVar23;
    uVar27 = uVar27 ^ uVar25;
    uVar22 = uVar27 << 7 | uVar27 >> 0x19;
    uVar29 = uVar29 + uVar17;
    uVar28 = uVar28 ^ uVar29;
    uVar27 = uVar28 << 0x10 | uVar28 >> 0x10;
    uVar26 = uVar26 + uVar27;
    uVar17 = uVar17 ^ uVar26;
    uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
    uVar29 = uVar29 + uVar17;
    uVar27 = uVar27 ^ uVar29;
    uVar27 = uVar27 << 8 | uVar27 >> 0x18;
    uVar26 = uVar26 + uVar27;
    uVar17 = uVar17 ^ uVar26;
    uVar17 = uVar17 << 7 | uVar17 >> 0x19;
    iVar21 = iVar21 + -1;
  } while (iVar21 != 0);
  iVar21 = local_94 + *(uint *)constant;
  *out = (uint8_t)iVar21;
  out[1] = (uint8_t)((uint)iVar21 >> 8);
  out[2] = (uint8_t)((uint)iVar21 >> 0x10);
  out[3] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = uVar20 + uVar1;
  out[4] = (uint8_t)iVar21;
  out[5] = (uint8_t)((uint)iVar21 >> 8);
  out[6] = (uint8_t)((uint)iVar21 >> 0x10);
  out[7] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = uVar30 + uVar2;
  out[8] = (uint8_t)iVar21;
  out[9] = (uint8_t)((uint)iVar21 >> 8);
  out[10] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0xb] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = uVar29 + uVar3;
  out[0xc] = (uint8_t)iVar21;
  out[0xd] = (uint8_t)((uint)iVar21 >> 8);
  out[0xe] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0xf] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = uVar17 + uVar4;
  out[0x10] = (uint8_t)iVar21;
  out[0x11] = (uint8_t)((uint)iVar21 >> 8);
  out[0x12] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0x13] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = uVar19 + uVar5;
  out[0x14] = (uint8_t)iVar21;
  out[0x15] = (uint8_t)((uint)iVar21 >> 8);
  out[0x16] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0x17] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = uVar18 + uVar6;
  out[0x18] = (uint8_t)iVar21;
  out[0x19] = (uint8_t)((uint)iVar21 >> 8);
  out[0x1a] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0x1b] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = uVar22 + uVar7;
  out[0x1c] = (uint8_t)iVar21;
  out[0x1d] = (uint8_t)((uint)iVar21 >> 8);
  out[0x1e] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0x1f] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = uVar25 + uVar8;
  out[0x20] = (uint8_t)iVar21;
  out[0x21] = (uint8_t)((uint)iVar21 >> 8);
  out[0x22] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0x23] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = uVar26 + uVar9;
  out[0x24] = (uint8_t)iVar21;
  out[0x25] = (uint8_t)((uint)iVar21 >> 8);
  out[0x26] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0x27] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = local_8c + uVar10;
  out[0x28] = (uint8_t)iVar21;
  out[0x29] = (uint8_t)((uint)iVar21 >> 8);
  out[0x2a] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0x2b] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = local_88 + uVar11;
  out[0x2c] = (uint8_t)iVar21;
  out[0x2d] = (uint8_t)((uint)iVar21 >> 8);
  out[0x2e] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0x2f] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = local_90 + uVar12;
  out[0x30] = (uint8_t)iVar21;
  out[0x31] = (uint8_t)((uint)iVar21 >> 8);
  out[0x32] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0x33] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = uVar23 + uVar13;
  out[0x34] = (uint8_t)iVar21;
  out[0x35] = (uint8_t)((uint)iVar21 >> 8);
  out[0x36] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0x37] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = uVar27 + uVar14;
  out[0x38] = (uint8_t)iVar21;
  out[0x39] = (uint8_t)((uint)iVar21 >> 8);
  out[0x3a] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0x3b] = (uint8_t)((uint)iVar21 >> 0x18);
  iVar21 = local_84 + uVar15;
  out[0x3c] = (uint8_t)iVar21;
  out[0x3d] = (uint8_t)((uint)iVar21 >> 8);
  out[0x3e] = (uint8_t)((uint)iVar21 >> 0x10);
  out[0x3f] = (uint8_t)((uint)iVar21 >> 0x18);
  return;
}

Assistant:

void cf_chacha20_core(const uint8_t key0[16],
                      const uint8_t key1[16],
                      const uint8_t nonce[16],
                      const uint8_t constant[16],
                      uint8_t out[64])
{
  uint32_t z0, z1, z2, z3, z4, z5, z6, z7,
           z8, z9, za, zb, zc, zd, ze, zf;

  uint32_t x0 = z0 = read32_le(constant + 0),
           x1 = z1 = read32_le(constant + 4),
           x2 = z2 = read32_le(constant + 8),
           x3 = z3 = read32_le(constant + 12),
           x4 = z4 = read32_le(key0 + 0),
           x5 = z5 = read32_le(key0 + 4),
           x6 = z6 = read32_le(key0 + 8),
           x7 = z7 = read32_le(key0 + 12),
           x8 = z8 = read32_le(key1 + 0),
           x9 = z9 = read32_le(key1 + 4),
           xa = za = read32_le(key1 + 8),
           xb = zb = read32_le(key1 + 12),
           xc = zc = read32_le(nonce + 0),
           xd = zd = read32_le(nonce + 4),
           xe = ze = read32_le(nonce + 8),
           xf = zf = read32_le(nonce + 12);

#define QUARTER(a, b, c, d) \
  a += b; d = rotl32(d ^ a, 16); \
  c += d; b = rotl32(b ^ c, 12); \
  a += b; d = rotl32(d ^ a, 8);  \
  c += d; b = rotl32(b ^ c, 7);

  int i;
  for (i = 0; i < 10; i++)
  {
    QUARTER(z0, z4, z8, zc);
    QUARTER(z1, z5, z9, zd);
    QUARTER(z2, z6, za, ze);
    QUARTER(z3, z7, zb, zf);
    QUARTER(z0, z5, za, zf);
    QUARTER(z1, z6, zb, zc);
    QUARTER(z2, z7, z8, zd);
    QUARTER(z3, z4, z9, ze);
  }

  x0 += z0;
  x1 += z1;
  x2 += z2;
  x3 += z3;
  x4 += z4;
  x5 += z5;
  x6 += z6;
  x7 += z7;
  x8 += z8;
  x9 += z9;
  xa += za;
  xb += zb;
  xc += zc;
  xd += zd;
  xe += ze;
  xf += zf;

  write32_le(x0, out + 0);
  write32_le(x1, out + 4);
  write32_le(x2, out + 8);
  write32_le(x3, out + 12);
  write32_le(x4, out + 16);
  write32_le(x5, out + 20);
  write32_le(x6, out + 24);
  write32_le(x7, out + 28);
  write32_le(x8, out + 32);
  write32_le(x9, out + 36);
  write32_le(xa, out + 40);
  write32_le(xb, out + 44);
  write32_le(xc, out + 48);
  write32_le(xd, out + 52);
  write32_le(xe, out + 56);
  write32_le(xf, out + 60);
}